

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O1

DeepFrameBuffer * __thiscall Imf_2_5::DeepTiledOutputFile::frameBuffer(DeepTiledOutputFile *this)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  int iVar2;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    pDVar1 = this->_data;
    pthread_mutex_unlock(__mutex);
    return &pDVar1->frameBuffer;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

const DeepFrameBuffer &
DeepTiledOutputFile::frameBuffer () const
{
    Lock lock (*_data->_streamData);
    return _data->frameBuffer;
}